

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall calculator::HexBinOctException::~HexBinOctException(HexBinOctException *this)

{
  SyntaxError::~SyntaxError((SyntaxError *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

HexBinOctException(const std::string& s) {
        error_msg = "Error: hex/oct/bin invalid [" + s + "]";
    }